

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

Value * minja::Value::callable(Value *__return_storage_ptr__,CallableType *callable)

{
  undefined1 local_21;
  shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
  local_20;
  
  local_20.
  super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>,std::allocator<std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>>,std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>const&>
            (&local_20.
              super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
              **)&local_20,
             (allocator<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
              *)&local_21,callable);
  Value(__return_storage_ptr__,&local_20);
  if (local_20.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value callable(const CallableType & callable) {
    return Value(std::make_shared<CallableType>(callable));
  }